

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

string * __thiscall
leveldb::InternalKey::DebugString_abi_cxx11_(string *__return_storage_ptr__,InternalKey *this)

{
  ulong uVar1;
  Slice *value;
  long in_FS_OFFSET;
  ParsedInternalKey parsed;
  ostringstream ss;
  pointer local_1e8;
  size_type local_1e0;
  ParsedInternalKey local_1d8;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d8.user_key.data_ = "";
  local_1d8.user_key.size_ = 0;
  uVar1 = (this->rep_)._M_string_length;
  if (7 < uVar1) {
    local_1d8.user_key.data_ = (this->rep_)._M_dataplus._M_p;
    local_1d8.type = (ValueType)*(ulong *)(local_1d8.user_key.data_ + (uVar1 - 8)) & 0xff;
    local_1d8.sequence = *(ulong *)(local_1d8.user_key.data_ + (uVar1 - 8)) >> 8;
    local_1d8.user_key.size_ = uVar1 - 8;
    if (local_1d8.type < 2) {
      ParsedInternalKey::DebugString_abi_cxx11_(__return_storage_ptr__,&local_1d8);
      goto LAB_00d387f9;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"(bad)",5);
  local_1e8 = (this->rep_)._M_dataplus._M_p;
  local_1e0 = (this->rep_)._M_string_length;
  EscapeString_abi_cxx11_(&local_1b8,(leveldb *)&local_1e8,value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
LAB_00d387f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}